

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O1

void __thiscall QtMWidgets::MessageBox::_q_clicked(MessageBox *this)

{
  MessageBoxPrivate *pMVar1;
  QAbstractButton *pQVar2;
  ButtonRole *pBVar3;
  long lVar4;
  
  QObject::sender();
  pQVar2 = (QAbstractButton *)QMetaObject::cast((QObject *)&QAbstractButton::staticMetaObject);
  pMVar1 = (this->d).d;
  pMVar1->clickedButton = pQVar2;
  pBVar3 = QMap<QAbstractButton_*,_QtMWidgets::MessageBox::ButtonRole>::operator[]
                     (&pMVar1->buttonsMap,&pMVar1->clickedButton);
  if (*pBVar3 == AcceptRole) {
    lVar4 = 0x1b8;
  }
  else {
    if (*pBVar3 != RejectRole) goto LAB_00160dc7;
    lVar4 = 0x1c0;
  }
  (**(code **)(*(long *)this + lVar4))(this);
LAB_00160dc7:
  buttonClicked(this,((this->d).d)->clickedButton);
  return;
}

Assistant:

void
MessageBox::_q_clicked()
{
	d->clickedButton = qobject_cast< QAbstractButton* > ( sender() );

	ButtonRole role = d->buttonsMap[ d->clickedButton ];

	switch( role )
	{
		case AcceptRole :
			accept();
			break;

		case RejectRole :
			reject();
			break;

		default :
			break;
	}

	emit buttonClicked( d->clickedButton );
}